

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O3

bool __thiscall
ymfm::fm_channel<ymfm::opn_registers_base<true>_>::prepare
          (fm_channel<ymfm::opn_registers_base<true>_> *this)

{
  bool bVar1;
  uint uVar2;
  uint32_t opnum;
  long lVar3;
  
  lVar3 = 0;
  uVar2 = 0;
  do {
    if (this->m_op[lVar3] != (fm_operator<ymfm::opn_registers_base<true>_> *)0x0) {
      bVar1 = fm_operator<ymfm::opn_registers_base<true>_>::prepare(this->m_op[lVar3]);
      if (bVar1) {
        uVar2 = uVar2 | 1 << ((uint)lVar3 & 0x1f);
      }
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  return uVar2 != 0;
}

Assistant:

bool fm_channel<RegisterType>::prepare()
{
	uint32_t active_mask = 0;

	// prepare all operators and determine if they are active
	for (uint32_t opnum = 0; opnum < array_size(m_op); opnum++)
		if (m_op[opnum] != nullptr)
			if (m_op[opnum]->prepare())
				active_mask |= 1 << opnum;

	return (active_mask != 0);
}